

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

pair<unsigned_long,_bool>
detail::do_try_get_deserialized_size<std::tuple<std::__cxx11::string,int>>
          (undefined8 param_1,undefined8 param_2)

{
  pair<unsigned_long,_bool> pVar1;
  undefined1 local_19;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_18 = &local_10;
  local_10 = param_1;
  local_8 = param_2;
  pVar1 = std::
          __invoke_impl<std::pair<unsigned_long,bool>,detail::do_try_get_deserialized_size<std::tuple<std::__cxx11::string,int>>(span<std::byte_const>,value_tag<(serialization_category)6>)::_lambda((auto:1)___)_1_,type_tag<std::__cxx11::string>,type_tag<int>>
                    (&local_18,&local_19);
  return pVar1;
}

Assistant:

std::pair<size_t, bool> do_try_get_deserialized_size(span<std::byte const> buffer, value_tag<serialization_category::tuple>) noexcept {
        return std::apply([&] (auto...tags) {
            auto const data_begin = buffer.begin();
            auto const try_one    = [&] (auto tag) {
                using value_type = remove_deep_constness_t<typename decltype(tag)::type>;
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return false;
                buffer.begin() += size;
                return true;
            };
            auto const success = (try_one(tags) && ...);
            return std::pair<size_t, bool>{ buffer.begin() - data_begin, success };
        }, map_tuple_types_t<T, tag_type>{});
    }